

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-generated-function-mockers.h
# Opt level: O0

void __thiscall
testing::internal::FunctionMocker<void_(unsigned_short,_unsigned_short)>::Invoke
          (FunctionMocker<void_(unsigned_short,_unsigned_short)> *this,unsigned_short a1,
          unsigned_short a2)

{
  tuple<unsigned_short,_unsigned_short> local_18;
  unsigned_short local_14;
  unsigned_short local_12;
  unsigned_short a2_local;
  FunctionMocker<void_(unsigned_short,_unsigned_short)> *pFStack_10;
  unsigned_short a1_local;
  FunctionMocker<void_(unsigned_short,_unsigned_short)> *this_local;
  
  local_14 = a2;
  local_12 = a1;
  pFStack_10 = this;
  std::tuple<unsigned_short,_unsigned_short>::tuple<unsigned_short,_unsigned_short,_true>
            (&local_18,&local_12,&local_14);
  FunctionMockerBase<void_(unsigned_short,_unsigned_short)>::InvokeWith
            (&this->super_FunctionMockerBase<void_(unsigned_short,_unsigned_short)>,&local_18);
  return;
}

Assistant:

R Invoke(A1 a1, A2 a2) {
    // Even though gcc and MSVC don't enforce it, 'this->' is required
    // by the C++ standard [14.6.4] here, as the base class type is
    // dependent on the template argument (and thus shouldn't be
    // looked into when resolving InvokeWith).
    return this->InvokeWith(ArgumentTuple(internal::forward<A1>(a1),
        internal::forward<A2>(a2)));
  }